

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

NetworkError statusCodeFromHttp(int httpStatusCode,QUrl *url)

{
  NetworkError NVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char> local_58;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = ProtocolInvalidOperationError;
  switch(httpStatusCode) {
  case 400:
  case 0x1a2:
    break;
  case 0x191:
    NVar1 = AuthenticationRequiredError;
    break;
  case 0x193:
    NVar1 = ContentAccessDenied;
    break;
  case 0x194:
    NVar1 = ContentNotFoundError;
    break;
  case 0x195:
    NVar1 = ContentOperationNotPermittedError;
    break;
  case 0x197:
    NVar1 = ProxyAuthenticationRequiredError;
    break;
  case 0x199:
    NVar1 = ContentConflictError;
    break;
  case 0x19a:
    NVar1 = ContentGoneError;
    break;
  default:
    if (httpStatusCode == 500) {
      NVar1 = InternalServerError;
      break;
    }
    if (httpStatusCode == 0x1f5) {
      NVar1 = OperationNotImplementedError;
      break;
    }
    if (httpStatusCode == 0x1f7) {
      NVar1 = ServiceUnavailableError;
      break;
    }
  case 0x192:
  case 0x196:
  case 0x198:
  case 0x19b:
  case 0x19c:
  case 0x19d:
  case 0x19e:
  case 0x19f:
  case 0x1a0:
  case 0x1a1:
    NVar1 = UnknownServerError;
    if ((httpStatusCode < 0x1f5) && (NVar1 = UnknownContentError, httpStatusCode < 400)) {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_28 = "default";
      QUrl::toString(&local_70,url,0);
      QString::toLocal8Bit((QByteArray *)&local_58,(QString *)&local_70);
      if (local_58.ptr == (char *)0x0) {
        local_58.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                (local_40,
                 "QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                 httpStatusCode,local_58.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      NVar1 = ProtocolFailure;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return NVar1;
}

Assistant:

static QNetworkReply::NetworkError statusCodeFromHttp(int httpStatusCode, const QUrl &url)
{
    QNetworkReply::NetworkError code;
    // we've got an error
    switch (httpStatusCode) {
    case 400:               // Bad Request
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 401:               // Authorization required
        code = QNetworkReply::AuthenticationRequiredError;
        break;

    case 403:               // Access denied
        code = QNetworkReply::ContentAccessDenied;
        break;

    case 404:               // Not Found
        code = QNetworkReply::ContentNotFoundError;
        break;

    case 405:               // Method Not Allowed
        code = QNetworkReply::ContentOperationNotPermittedError;
        break;

    case 407:
        code = QNetworkReply::ProxyAuthenticationRequiredError;
        break;

    case 409:               // Resource Conflict
        code = QNetworkReply::ContentConflictError;
        break;

    case 410:               // Content no longer available
        code = QNetworkReply::ContentGoneError;
        break;

    case 418:               // I'm a teapot
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 500:               // Internal Server Error
        code = QNetworkReply::InternalServerError;
        break;

    case 501:               // Server does not support this functionality
        code = QNetworkReply::OperationNotImplementedError;
        break;

    case 503:               // Service unavailable
        code = QNetworkReply::ServiceUnavailableError;
        break;

    default:
        if (httpStatusCode > 500) {
            // some kind of server error
            code = QNetworkReply::UnknownServerError;
        } else if (httpStatusCode >= 400) {
            // content error we did not handle above
            code = QNetworkReply::UnknownContentError;
        } else {
            qWarning("QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                     httpStatusCode, qPrintable(url.toString()));
            code = QNetworkReply::ProtocolFailure;
        }
    }

    return code;
}